

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall
Catch::Generators::GeneratorTracker::setGenerator
          (GeneratorTracker *this,GeneratorBasePtr *generator)

{
  GeneratorBasePtr *generator_local;
  GeneratorTracker *this_local;
  
  clara::std::
  unique_ptr<Catch::Generators::GeneratorUntypedBase,_std::default_delete<Catch::Generators::GeneratorUntypedBase>_>
  ::operator=(&this->m_generator,generator);
  return;
}

Assistant:

void setGenerator( GeneratorBasePtr&& generator ) override {
                m_generator = std::move( generator );
            }